

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsafec.c
# Opt level: O3

void grid_factor(int p,int *idx,int *idy)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  double dVar9;
  int fac [256];
  int prime [256];
  int aiStack_840 [258];
  int aiStack_438 [258];
  
  dVar9 = (double)p;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  if (0 < (int)dVar9) {
    aiStack_840[1] = p;
    uVar5 = 0;
    iVar6 = 2;
    do {
      if (0 < (int)uVar5) {
        uVar7 = 0;
        do {
          if (iVar6 % aiStack_438[uVar7] == 0) goto LAB_00103940;
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
        if (0xff < (int)uVar5) {
          puts("Overflow in grid_factor");
        }
      }
      lVar3 = (long)(int)uVar5;
      uVar5 = uVar5 + 1;
      aiStack_438[lVar3] = iVar6;
LAB_00103940:
      bVar8 = iVar6 != (int)dVar9 + 1;
      iVar6 = iVar6 + 1;
    } while (bVar8);
    p = aiStack_840[1];
    if (0 < (int)uVar5) {
      uVar7 = 0;
      iVar6 = 0;
      do {
        iVar1 = aiStack_438[uVar7];
        if (aiStack_840[1] % iVar1 == 0) {
          piVar4 = aiStack_840 + (long)iVar6 + 2;
          do {
            *piVar4 = iVar1;
            lVar3 = (long)aiStack_840[1];
            aiStack_840[1] = (int)(lVar3 / (long)iVar1);
            piVar4 = piVar4 + 1;
            iVar6 = iVar6 + 1;
          } while ((int)((long)((ulong)(uint)(aiStack_840[1] >> 0x1f) << 0x20 |
                               lVar3 / (long)iVar1 & 0xffffffffU) % (long)iVar1) == 0);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar5);
      if (iVar6 != 0) {
        *idx = 1;
        *idy = 1;
        if (iVar6 < 1) {
          return;
        }
        goto LAB_001039c1;
      }
    }
  }
  aiStack_840[2] = p;
  *idx = 1;
  *idy = 1;
  iVar6 = 0;
LAB_001039c1:
  uVar7 = (ulong)(iVar6 + (uint)(iVar6 == 0)) + 1;
  do {
    iVar6 = *idx;
    iVar1 = *idy;
    iVar2 = iVar1;
    if (iVar6 < iVar1) {
      iVar2 = iVar6;
    }
    piVar4 = idx;
    if (iVar1 < iVar6) {
      piVar4 = idy;
    }
    *piVar4 = iVar2 * aiStack_840[uVar7];
    uVar7 = uVar7 - 1;
  } while (1 < uVar7);
  return;
}

Assistant:

void grid_factor(int p, int *idx, int *idy) {
  int i, j; 
  int ip, ifac, pmax, prime[MAX_FACTOR];
  int fac[MAX_FACTOR];
  int ix, iy, ichk;

  i = 1;
/**
 *   factor p completely
 *   first, find all prime numbers, besides 1, less than or equal to 
 *   the square root of p
 */
  ip = (int)(sqrt((double)p))+1;
  pmax = 0;
  for (i=2; i<=ip; i++) {
    ichk = 1;
    for (j=0; j<pmax; j++) {
      if (i%prime[j] == 0) {
        ichk = 0;
        break;
      }
    }
    if (ichk) {
      pmax = pmax + 1;
      if (pmax > MAX_FACTOR) printf("Overflow in grid_factor\n");
      prime[pmax-1] = i;
    }
  }
/**
 *   find all prime factors of p
 */
  ip = p;
  ifac = 0;
  for (i=0; i<pmax; i++) {
    while(ip%prime[i] == 0) {
      ifac = ifac + 1;
      fac[ifac-1] = prime[i];
      ip = ip/prime[i];
    }
  }
/**
 *  p is prime
 */
  if (ifac==0) {
    ifac++;
    fac[0] = p;
  }
/**
 *    find two factors of p of approximately the
 *    same size
 */
  *idx = 1;
  *idy = 1;
  for (i = ifac-1; i >= 0; i--) {
    ix = *idx;
    iy = *idy;
    if (ix <= iy) {
      *idx = fac[i]*(*idx);
    } else {
      *idy = fac[i]*(*idy);
    }
  }
}